

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundingbox.cpp
# Opt level: O0

bool __thiscall BoundingBox::containsPoint(BoundingBox *this,vec3 *p)

{
  bool local_19;
  vec3 *p_local;
  BoundingBox *this_local;
  
  local_19 = false;
  if (((((this->min).field_0.field_0.x <= (p->field_0).field_0.x) &&
       (local_19 = false, (this->min).field_0.field_0.y <= (p->field_0).field_0.y)) &&
      (local_19 = false, (this->min).field_0.field_0.z <= (p->field_0).field_0.z)) &&
     ((local_19 = false, (p->field_0).field_0.x <= (this->max).field_0.field_0.x &&
      (local_19 = false, (p->field_0).field_0.y <= (this->max).field_0.field_0.y)))) {
    local_19 = (p->field_0).field_0.z <= (this->max).field_0.field_0.z;
  }
  return local_19;
}

Assistant:

bool BoundingBox::containsPoint(glm::vec3 &p) {
    return (min.x <= p.x && 
            min.y <= p.y && 
            min.z <= p.z &&
            max.x >= p.x &&
            max.y >= p.y &&
            max.z >= p.z );
}